

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int modifyPagePointer(MemPage *pPage,Pgno iFrom,Pgno iTo,u8 eType)

{
  ushort uVar1;
  u32 uVar2;
  u32 uVar3;
  u8 *p;
  char in_CL;
  u32 in_EDX;
  u32 in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  u8 *pCell;
  int rc;
  int nCell;
  int i;
  CellInfo info;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint local_40;
  int local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_CL == '\x04') {
    uVar2 = sqlite3Get4byte(*(u8 **)(in_RDI + 0x50));
    if (uVar2 != in_ESI) {
      local_24 = sqlite3CorruptError(0);
      goto LAB_0016ef45;
    }
    sqlite3Put4byte(*(uchar **)(in_RDI + 0x50),in_EDX);
  }
  else {
    if (*in_RDI == '\0') {
      local_24 = btreeInitPage((MemPage *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    else {
      local_24 = 0;
    }
    if (local_24 != 0) goto LAB_0016ef45;
    uVar1 = *(ushort *)(in_RDI + 0x18);
    for (local_40 = 0; (int)local_40 < (int)(uint)uVar1; local_40 = local_40 + 1) {
      p = (u8 *)(*(long *)(in_RDI + 0x50) +
                (long)(int)(uint)(*(ushort *)(in_RDI + 0x1a) &
                                 CONCAT11(*(undefined1 *)
                                           (*(long *)(in_RDI + 0x60) + (long)(int)(local_40 << 1)),
                                          *(undefined1 *)
                                           (*(long *)(in_RDI + 0x60) + 1 +
                                           (long)(int)(local_40 << 1)))));
      if (in_CL == '\x03') {
        local_20 = &DAT_aaaaaaaaaaaaaaaa;
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        (**(code **)(in_RDI + 0x80))(in_RDI,p,&local_20);
        if (local_10._4_2_ < (uint)local_10) {
          if ((u8 *)(*(long *)(in_RDI + 0x50) + (ulong)*(uint *)(*(long *)(in_RDI + 0x48) + 0x38)) <
              p + (int)(uint)local_10._6_2_) {
            local_24 = sqlite3CorruptError(0);
            goto LAB_0016ef45;
          }
          uVar2 = in_ESI;
          uVar3 = sqlite3Get4byte(p + (long)(int)(uint)local_10._6_2_ + -4);
          if (uVar2 == uVar3) {
            sqlite3Put4byte(p + (long)(int)(uint)local_10._6_2_ + -4,in_EDX);
            break;
          }
        }
      }
      else {
        if ((u8 *)(*(long *)(in_RDI + 0x50) + (ulong)*(uint *)(*(long *)(in_RDI + 0x48) + 0x38)) <
            p + 4) {
          local_24 = sqlite3CorruptError(0);
          goto LAB_0016ef45;
        }
        uVar2 = sqlite3Get4byte(p);
        if (uVar2 == in_ESI) {
          sqlite3Put4byte(p,in_EDX);
          break;
        }
      }
    }
    if (local_40 == uVar1) {
      if ((in_CL != '\x05') ||
         (uVar2 = sqlite3Get4byte((u8 *)(*(long *)(in_RDI + 0x50) + (long)(int)((byte)in_RDI[9] + 8)
                                        )), uVar2 != in_ESI)) {
        local_24 = sqlite3CorruptError(0);
        goto LAB_0016ef45;
      }
      sqlite3Put4byte((uchar *)(*(long *)(in_RDI + 0x50) + (long)(int)((byte)in_RDI[9] + 8)),in_EDX)
      ;
    }
  }
  local_24 = 0;
LAB_0016ef45:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_24;
}

Assistant:

static int modifyPagePointer(MemPage *pPage, Pgno iFrom, Pgno iTo, u8 eType){
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( eType==PTRMAP_OVERFLOW2 ){
    /* The pointer is always the first 4 bytes of the page in this case.  */
    if( get4byte(pPage->aData)!=iFrom ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    put4byte(pPage->aData, iTo);
  }else{
    int i;
    int nCell;
    int rc;

    rc = pPage->isInit ? SQLITE_OK : btreeInitPage(pPage);
    if( rc ) return rc;
    nCell = pPage->nCell;

    for(i=0; i<nCell; i++){
      u8 *pCell = findCell(pPage, i);
      if( eType==PTRMAP_OVERFLOW1 ){
        CellInfo info;
        pPage->xParseCell(pPage, pCell, &info);
        if( info.nLocal<info.nPayload ){
          if( pCell+info.nSize > pPage->aData+pPage->pBt->usableSize ){
            return SQLITE_CORRUPT_PAGE(pPage);
          }
          if( iFrom==get4byte(pCell+info.nSize-4) ){
            put4byte(pCell+info.nSize-4, iTo);
            break;
          }
        }
      }else{
        if( pCell+4 > pPage->aData+pPage->pBt->usableSize ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( get4byte(pCell)==iFrom ){
          put4byte(pCell, iTo);
          break;
        }
      }
    }

    if( i==nCell ){
      if( eType!=PTRMAP_BTREE ||
          get4byte(&pPage->aData[pPage->hdrOffset+8])!=iFrom ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      put4byte(&pPage->aData[pPage->hdrOffset+8], iTo);
    }
  }
  return SQLITE_OK;
}